

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void stranspose(double *sig,int rows,int cols,double *col)

{
  int local_30;
  int local_2c;
  int j;
  int i;
  int u;
  int t;
  double *col_local;
  int cols_local;
  int rows_local;
  double *sig_local;
  
  for (local_2c = 0; local_2c < rows; local_2c = local_2c + 1) {
    j = 0;
    for (local_30 = 0; local_30 < cols; local_30 = local_30 + 1) {
      col[j + local_2c] = sig[local_30 + local_2c * cols];
      j = rows + j;
    }
  }
  return;
}

Assistant:

void stranspose(double *sig, int rows, int cols,double *col) {
	int t,u;
	register int i,j;
	#pragma omp parallel for private(i,j,t,u)
	for (i=0; i < rows; i++) {
		t = i * cols;
		u = 0;
		for (j=0; j < cols; j++) {
			col[u+i] = sig[j+t];
			u+=rows;
		}
	}
	
}